

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

ISceneNode * __thiscall
irr::scene::CSceneManager::getSceneNodeFromId(CSceneManager *this,s32 id,ISceneNode *start)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *plVar2;
  _List_node_base *p_Var3;
  
  if (start == (ISceneNode *)0x0) {
    iVar1 = (*(this->super_ISceneManager)._vptr_ISceneManager[9])(this);
    start = (ISceneNode *)CONCAT44(extraout_var,iVar1);
  }
  iVar1 = (*start->_vptr_ISceneNode[0xf])(start);
  if (iVar1 != id) {
    plVar2 = &start->Children;
    p_Var3 = (_List_node_base *)plVar2;
    do {
      p_Var3 = (((_List_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *)
                &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var3 == (_List_node_base *)plVar2) {
        return (ISceneNode *)0x0;
      }
      iVar1 = (*(this->super_ISceneManager)._vptr_ISceneManager[10])(this,id,p_Var3[1]._M_next);
      start = (ISceneNode *)CONCAT44(extraout_var_00,iVar1);
    } while (start == (ISceneNode *)0x0);
  }
  return start;
}

Assistant:

ISceneNode *CSceneManager::getSceneNodeFromId(s32 id, ISceneNode *start)
{
	if (start == 0)
		start = getRootSceneNode();

	if (start->getID() == id)
		return start;

	ISceneNode *node = 0;

	const ISceneNodeList &list = start->getChildren();
	ISceneNodeList::const_iterator it = list.begin();
	for (; it != list.end(); ++it) {
		node = getSceneNodeFromId(id, *it);
		if (node)
			return node;
	}

	return 0;
}